

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitwriter_buffer.c
# Opt level: O2

void aom_wb_write_bit(aom_write_bit_buffer *wb,int bit)

{
  byte *pbVar1;
  uint32_t uVar2;
  int iVar3;
  byte bVar4;
  
  uVar2 = wb->bit_offset;
  iVar3 = (int)uVar2 / 8;
  if ((int)((long)(int)uVar2 % 8) == 0) {
    wb->bit_buffer[iVar3] = (char)bit << 7;
  }
  else {
    bVar4 = 7 - (char)((long)(int)uVar2 % 8);
    pbVar1 = wb->bit_buffer + iVar3;
    *pbVar1 = *pbVar1 & ~(byte)(1 << (bVar4 & 0x1f));
    wb->bit_buffer[iVar3] = wb->bit_buffer[iVar3] | (byte)(bit << (bVar4 & 0x1f));
  }
  wb->bit_offset = uVar2 + 1;
  return;
}

Assistant:

void aom_wb_write_bit(struct aom_write_bit_buffer *wb, int bit) {
  const int off = (int)wb->bit_offset;
  const int p = off / CHAR_BIT;
  const int q = CHAR_BIT - 1 - off % CHAR_BIT;
  if (q == CHAR_BIT - 1) {
    // Zero next char and write bit
    wb->bit_buffer[p] = bit << q;
  } else {
    wb->bit_buffer[p] &= ~(1 << q);
    wb->bit_buffer[p] |= bit << q;
  }
  wb->bit_offset = off + 1;
}